

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::functype<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  bool bVar1;
  string_view expected;
  undefined1 local_d8 [8];
  MaybeResult<wasm::Ok> parsedParams;
  string local_90 [32];
  undefined1 local_70 [8];
  MaybeResult<unsigned_long> parsedResults;
  MaybeResult<unsigned_long> _val_1;
  
  expected._M_str = "func";
  expected._M_len = 4;
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar1) {
    params<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_d8,ctx,true);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70,
                    (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_d8);
    if (parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20),
                 (string *)local_70);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                 (__index_type *)
                 ((long)&parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&parsedResults.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>
                         .super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_70);
      results<wasm::WATParser::ParseDeclsCtx>((MaybeResult<unsigned_long> *)local_70,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_unsigned_long,_wasm::None,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_unsigned_long,_wasm::None,_wasm::Err> *)
                      ((long)&parsedResults.val.
                              super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20),
                      (_Copy_ctor_base<false,_unsigned_long,_wasm::None,_wasm::Err> *)local_70);
      if (_val_1.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02')
      {
        std::__cxx11::string::string
                  (local_90,(string *)
                            ((long)&parsedResults.val.
                                    super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> +
                            0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_90);
        std::__cxx11::string::~string(local_90);
        std::__detail::__variant::_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err> *)
                          ((long)&parsedResults.val.
                                  super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> +
                          0x20));
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err> *)
                          ((long)&parsedResults.val.
                                  super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> +
                          0x20));
        bVar1 = Lexer::takeRParen(&ctx->in);
        if (bVar1) {
          *(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     ((long)&parsedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                     "expected end of functype",(allocator<char> *)local_90);
          Lexer::err((Err *)((long)&parsedResults.val.
                                    super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> +
                            0x20),&ctx->in,
                     (string *)
                     ((long)&parsedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,(__index_type *)
                      ((long)&parsedResults.val.
                              super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20));
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&parsedResults.val.
                             super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20));
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&parsedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        }
      }
      std::__detail::__variant::_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err> *)local_70);
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_d8);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::SignatureT> functype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("func"sv)) {
    return {};
  }

  auto parsedParams = params(ctx);
  CHECK_ERR(parsedParams);

  auto parsedResults = results(ctx);
  CHECK_ERR(parsedResults);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of functype");
  }

  return ctx.makeFuncType(parsedParams.getPtr(), parsedResults.getPtr());
}